

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteBytes
               (int field_number,string *value,CodedOutputStream *output)

{
  byte *pbVar1;
  bool bVar2;
  LogMessage *other;
  int iVar3;
  byte *pbVar4;
  uint32 uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar7 = field_number * 8 + 2;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar7);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar4 = pbVar1;
    uVar5 = uVar7;
    if (0x7f < (uint)(field_number << 3)) {
      do {
        *pbVar4 = (byte)uVar7 | 0x80;
        uVar5 = uVar7 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar5;
      } while (bVar2);
    }
    *pbVar4 = (byte)uVar5;
    iVar3 = ((int)pbVar4 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar3;
    output->buffer_size_ = output->buffer_size_ - iVar3;
  }
  uVar8 = value->_M_string_length;
  if ((uVar8 & 0xffffffff80000000) != 0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x20e);
    other = LogMessage::operator<<(&local_50,"CHECK failed: (value.size()) <= (kint32max): ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
    uVar8 = value->_M_string_length;
  }
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,(uint32)uVar8);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar4 = pbVar1;
    if ((uint32)uVar8 < 0x80) {
      uVar6 = uVar8 & 0xffffffff;
    }
    else {
      uVar6 = uVar8 & 0xffffffff;
      do {
        uVar7 = (uint)uVar8;
        *pbVar4 = (byte)uVar8 | 0x80;
        uVar6 = uVar6 >> 7;
        pbVar4 = pbVar4 + 1;
        uVar8 = uVar6;
      } while (0x3fff < uVar7);
    }
    *pbVar4 = (byte)uVar6;
    iVar3 = ((int)pbVar4 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar3;
    output->buffer_size_ = output->buffer_size_ - iVar3;
  }
  io::CodedOutputStream::WriteRaw(output,(value->_M_dataplus)._M_p,(int)value->_M_string_length);
  return;
}

Assistant:

void WireFormatLite::WriteBytes(int field_number, const string& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kint32max);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}